

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O1

void R_InstallSprite(int num)

{
  undefined8 *puVar1;
  ushort uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  TextureHash *pTVar11;
  spriteframe_t *psVar12;
  uint uVar13;
  WORD WVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int rot;
  long lVar18;
  long lVar19;
  bool bVar20;
  
  if (maxframe == -1) {
    sprites.Array[num].numframes = '\0';
  }
  else {
    iVar3 = maxframe + 1;
    bVar20 = -1 < maxframe;
    maxframe = iVar3;
    if (bVar20) {
      lVar18 = 0xa9305c;
      lVar19 = 0xa93058;
      lVar17 = 0;
      do {
        iVar3 = *(int *)&sprtemp[lVar17].super_spriteframe_t.field_0x4c;
        if (iVar3 == 1) {
          lVar16 = 0;
          do {
            if (*(int *)(lVar18 + lVar16 * 4) < 1) {
              *(undefined4 *)(lVar18 + lVar16 * 4) = *(undefined4 *)(lVar18 + -4 + lVar16 * 4);
              uVar2 = sprtemp[lVar17].super_spriteframe_t.Flip;
              if ((uVar2 >> ((uint)lVar16 & 0x1f) & 1) != 0) {
                sprtemp[lVar17].super_spriteframe_t.Flip =
                     uVar2 | (ushort)(2 << ((byte)lVar16 & 0x1f));
              }
            }
            if (*(int *)(lVar18 + -4 + lVar16 * 4) < 1) {
              *(undefined4 *)(lVar18 + -4 + lVar16 * 4) = *(undefined4 *)(lVar18 + lVar16 * 4);
              uVar2 = sprtemp[lVar17].super_spriteframe_t.Flip;
              if ((uVar2 >> ((byte)lVar16 & 0x1f) & 2) != 0) {
                sprtemp[lVar17].super_spriteframe_t.Flip =
                     uVar2 | (ushort)(1 << ((uint)lVar16 & 0x1f));
              }
            }
            lVar16 = lVar16 + 2;
          } while (lVar16 != 0x10);
          lVar16 = 0;
          do {
            if (*(int *)(lVar19 + lVar16 * 4) < 1) {
              I_FatalError("R_InstallSprite: Sprite %s frame %c is missing rotations",
                           sprites.Array + num,(ulong)((int)lVar17 + 0x41));
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x10);
        }
        else if (iVar3 == 0) {
          lVar16 = 0;
          do {
            *(int *)(lVar18 + lVar16 * 4) = sprtemp[lVar17].super_spriteframe_t.Texture[0].texnum;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0xf);
          if ((sprtemp[lVar17].super_spriteframe_t.Flip & 1) != 0) {
            sprtemp[lVar17].super_spriteframe_t.Flip = 0xffff;
          }
        }
        lVar17 = lVar17 + 1;
        lVar18 = lVar18 + 0x50;
        lVar19 = lVar19 + 0x50;
      } while (lVar17 < maxframe);
    }
    iVar3 = maxframe;
    if (0 < maxframe) {
      uVar15 = (ulong)(uint)maxframe;
      lVar17 = 0;
      do {
        if (*(int *)((long)(sprtemp[0].super_spriteframe_t.Texture + 0x11) + lVar17) == -1) {
          *(undefined4 *)((long)(sprtemp[0].super_spriteframe_t.Texture + 0x11) + lVar17) = 0;
          *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[0xc].texnum + lVar17) = 0;
          *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[0xe].texnum + lVar17) = 0;
          *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[8].texnum + lVar17) = 0;
          *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[10].texnum + lVar17) = 0;
          *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[0].texnum + lVar17) = 0;
          *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[2].texnum + lVar17) = 0;
          *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[4].texnum + lVar17) = 0;
          *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[6].texnum + lVar17) = 0;
          *(undefined2 *)((long)(sprtemp[0].super_spriteframe_t.Texture + 0x10) + lVar17) = 0;
        }
        lVar17 = lVar17 + 0x50;
      } while (uVar15 * 0x50 != lVar17);
    }
    sprites.Array[num].numframes = (BYTE)iVar3;
    TArray<spriteframe_t,_spriteframe_t>::Grow(&SpriteFrames,iVar3);
    uVar13 = SpriteFrames.Count;
    WVar14 = (WORD)SpriteFrames.Count;
    SpriteFrames.Count = iVar3 + SpriteFrames.Count;
    sprites.Array[num].spriteframes = WVar14;
    iVar3 = maxframe;
    psVar12 = SpriteFrames.Array;
    lVar17 = (long)maxframe;
    if (0 < lVar17) {
      lVar18 = 0;
      do {
        uVar4 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[0].texnum + lVar18);
        uVar5 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[2].texnum + lVar18);
        uVar6 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[4].texnum + lVar18);
        uVar7 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[6].texnum + lVar18);
        uVar8 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[8].texnum + lVar18);
        uVar9 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[10].texnum + lVar18);
        uVar10 = *(undefined8 *)((long)&sprtemp[0].super_spriteframe_t.Texture[0xe].texnum + lVar18)
        ;
        puVar1 = (undefined8 *)((long)&psVar12[(int)uVar13].Texture[0xc].texnum + lVar18);
        *puVar1 = *(undefined8 *)
                   ((long)&sprtemp[0].super_spriteframe_t.Texture[0xc].texnum + lVar18);
        puVar1[1] = uVar10;
        puVar1 = (undefined8 *)((long)&psVar12[(int)uVar13].Texture[8].texnum + lVar18);
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        puVar1 = (undefined8 *)((long)&psVar12[(int)uVar13].Texture[4].texnum + lVar18);
        *puVar1 = uVar6;
        puVar1[1] = uVar7;
        puVar1 = (undefined8 *)((long)&psVar12[(int)uVar13].Texture[0].texnum + lVar18);
        *puVar1 = uVar4;
        puVar1[1] = uVar5;
        *(undefined2 *)((long)(psVar12[(int)uVar13].Texture + 0x10) + lVar18) =
             *(undefined2 *)((long)(sprtemp[0].super_spriteframe_t.Texture + 0x10) + lVar18);
        *(undefined8 *)
         ((long)&((spriteframe_t *)(psVar12[(int)uVar13].Texture + -2))->Voxel + lVar18) =
             *(undefined8 *)
              ((long)&((spriteframe_t *)(sprtemp[0].super_spriteframe_t.Texture + -2))->Voxel +
              lVar18);
        lVar18 = lVar18 + 0x50;
      } while (lVar17 * 0x50 != lVar18);
    }
    pTVar11 = TexMan.Textures.Array;
    if (0 < iVar3) {
      lVar18 = 0xa93058;
      lVar19 = 0;
      do {
        if (*(int *)&sprtemp[lVar19].super_spriteframe_t.field_0x4c == 1) {
          lVar16 = 0;
          do {
            (pTVar11[*(int *)(lVar18 + lVar16 * 4)].Texture)->Rotations = (short)lVar19 + WVar14;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x10);
        }
        lVar19 = lVar19 + 1;
        lVar18 = lVar18 + 0x50;
      } while (lVar19 != lVar17);
    }
  }
  return;
}

Assistant:

static void R_InstallSprite (int num)
{
	int frame;
	int framestart;
	int rot;
//	int undefinedFix;

	if (maxframe == -1)
	{
		sprites[num].numframes = 0;
		return;
	}

	maxframe++;

	// [RH] If any frames are undefined, but there are some defined frames, map
	// them to the first defined frame. This is a fix for Doom Raider, which actually
	// worked with ZDoom 2.0.47, because of a bug here. It does not define frames A,
	// B, or C for the sprite PSBG, but because I had sprtemp[].rotate defined as a
	// bool, this code never detected that it was not actually present. After switching
	// to the unified texture system, this caused it to crash while loading the wad.

// [RH] Let undefined frames actually be blank because LWM uses this in at least
// one of her wads.
//	for (frame = 0; frame < maxframe && sprtemp[frame].rotate == -1; ++frame)
//	{ }
//
//	undefinedFix = frame;

	for (frame = 0; frame < maxframe; ++frame)
	{
		switch (sprtemp[frame].rotate)
		{
		case -1:
			// no rotations were found for that frame at all
			//I_FatalError ("R_InstallSprite: No patches found for %s frame %c", sprites[num].name, frame+'A');
			break;
			
		case 0:
			// only the first rotation is needed
			for (rot = 1; rot < 16; ++rot)
			{
				sprtemp[frame].Texture[rot] = sprtemp[frame].Texture[0];
			}
			// If the frame is flipped, they all should be
			if (sprtemp[frame].Flip & 1)
			{
				sprtemp[frame].Flip = 0xFFFF;
			}
			break;
					
		case 1:
			// must have all 8 frame pairs
			for (rot = 0; rot < 8; ++rot)
			{
				if (!sprtemp[frame].Texture[rot*2+1].isValid())
				{
					sprtemp[frame].Texture[rot*2+1] = sprtemp[frame].Texture[rot*2];
					if (sprtemp[frame].Flip & (1 << (rot*2)))
					{
						sprtemp[frame].Flip |= 1 << (rot*2+1);
					}
				}
				if (!sprtemp[frame].Texture[rot*2].isValid())
				{
					sprtemp[frame].Texture[rot*2] = sprtemp[frame].Texture[rot*2+1];
					if (sprtemp[frame].Flip & (1 << (rot*2+1)))
					{
						sprtemp[frame].Flip |= 1 << (rot*2);
					}
				}

			}
			for (rot = 0; rot < 16; ++rot)
			{
				if (!sprtemp[frame].Texture[rot].isValid())
					I_FatalError ("R_InstallSprite: Sprite %s frame %c is missing rotations",
									sprites[num].name, frame+'A');
			}
			break;
		}
	}

	for (frame = 0; frame < maxframe; ++frame)
	{
		if (sprtemp[frame].rotate == -1)
		{
			memset (&sprtemp[frame].Texture, 0, sizeof(sprtemp[0].Texture));
			sprtemp[frame].Flip = 0;
			sprtemp[frame].rotate = 0;
		}
	}
	
	// allocate space for the frames present and copy sprtemp to it
	sprites[num].numframes = maxframe;
	sprites[num].spriteframes = WORD(framestart = SpriteFrames.Reserve (maxframe));
	for (frame = 0; frame < maxframe; ++frame)
	{
		memcpy (SpriteFrames[framestart+frame].Texture, sprtemp[frame].Texture, sizeof(sprtemp[frame].Texture));
		SpriteFrames[framestart+frame].Flip = sprtemp[frame].Flip;
		SpriteFrames[framestart+frame].Voxel = sprtemp[frame].Voxel;
	}

	// Let the textures know about the rotations
	for (frame = 0; frame < maxframe; ++frame)
	{
		if (sprtemp[frame].rotate == 1)
		{
			for (int rot = 0; rot < 16; ++rot)
			{
				TexMan[sprtemp[frame].Texture[rot]]->Rotations = framestart + frame;
			}
		}
	}
}